

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eset.c
# Opt level: O2

void duckdb_je_eset_insert(eset_t *eset,edata_t *edata)

{
  atomic_zu_t *paVar1;
  ulong uVar2;
  void *pvVar3;
  uint64_t uVar4;
  edata_t *peVar5;
  long lVar6;
  _Bool _Var7;
  size_t sVar8;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  ulong size;
  edata_cmp_summary_t a;
  
  uVar2 = (edata->field_2).e_size_esn;
  size = uVar2 & 0xfffffffffffff000;
  sVar8 = duckdb_je_sz_psz_quantize_floor(size);
  if (sVar8 < 0x7000000000000001) {
    uVar11 = sVar8 - 1;
    if (uVar11 == 0) {
      uVar10 = 0x40;
    }
    else {
      lVar6 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      uVar10 = (uint)lVar6 ^ 0x3f;
    }
    iVar12 = 0x32 - uVar10;
    if (0x32 < uVar10) {
      iVar12 = 0;
    }
    bVar9 = 0xc;
    if (0x4000 < sVar8) {
      bVar9 = (char)iVar12 + 0xb;
    }
    uVar11 = (ulong)(((uint)(uVar11 >> (bVar9 & 0x3f)) & 3) + iVar12 * 4);
  }
  else {
    uVar11 = 199;
  }
  pvVar3 = edata->e_addr;
  uVar4 = edata->e_sn;
  _Var7 = duckdb_je_edata_heap_empty(&eset->bins[uVar11].heap);
  if (_Var7) {
    eset->bitmap[uVar11 >> 6] = eset->bitmap[uVar11 >> 6] | 1L << ((byte)uVar11 & 0x3f);
    eset->bins[uVar11].heap_min.sn = uVar4;
  }
  else {
    a.addr = (uintptr_t)pvVar3;
    a.sn = uVar4;
    iVar12 = edata_cmp_summary_comp(a,eset->bins[uVar11].heap_min);
    if (-1 < iVar12) goto LAB_00e6cd91;
    eset->bins[uVar11].heap_min.sn = uVar4;
  }
  eset->bins[uVar11].heap_min.addr = (uintptr_t)pvVar3;
LAB_00e6cd91:
  duckdb_je_edata_heap_insert(&eset->bins[uVar11].heap,edata);
  eset->bin_stats[uVar11].nextents.repr = eset->bin_stats[uVar11].nextents.repr + 1;
  paVar1 = &eset->bin_stats[uVar11].nbytes;
  paVar1->repr = paVar1->repr + size;
  (edata->field_6).ql_link_inactive.qre_next = edata;
  (edata->field_6).ql_link_inactive.qre_prev = edata;
  peVar5 = (eset->lru).head.qlh_first;
  if (peVar5 != (edata_t *)0x0) {
    (edata->field_6).ql_link_inactive.qre_next = (peVar5->field_6).ql_link_inactive.qre_prev;
    (((eset->lru).head.qlh_first)->field_6).ql_link_inactive.qre_prev = edata;
    (edata->field_6).ql_link_inactive.qre_prev =
         (((edata->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next;
    peVar5 = (eset->lru).head.qlh_first;
    (((peVar5->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next = peVar5;
    (((edata->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next = edata;
    edata = (edata->field_6).ql_link_inactive.qre_next;
  }
  (eset->lru).head.qlh_first = edata;
  (eset->npages).repr = (eset->npages).repr + (uVar2 >> 0xc);
  return;
}

Assistant:

void
eset_insert(eset_t *eset, edata_t *edata) {
	assert(edata_state_get(edata) == eset->state);

	size_t size = edata_size_get(edata);
	size_t psz = sz_psz_quantize_floor(size);
	pszind_t pind = sz_psz2ind(psz);

	edata_cmp_summary_t edata_cmp_summary = edata_cmp_summary_get(edata);
	if (edata_heap_empty(&eset->bins[pind].heap)) {
		fb_set(eset->bitmap, ESET_NPSIZES, (size_t)pind);
		/* Only element is automatically the min element. */
		eset->bins[pind].heap_min = edata_cmp_summary;
	} else {
		/*
		 * There's already a min element; update the summary if we're
		 * about to insert a lower one.
		 */
		if (edata_cmp_summary_comp(edata_cmp_summary,
		    eset->bins[pind].heap_min) < 0) {
			eset->bins[pind].heap_min = edata_cmp_summary;
		}
	}
	edata_heap_insert(&eset->bins[pind].heap, edata);

	if (config_stats) {
		eset_stats_add(eset, pind, size);
	}

	edata_list_inactive_append(&eset->lru, edata);
	size_t npages = size >> LG_PAGE;
	/*
	 * All modifications to npages hold the mutex (as asserted above), so we
	 * don't need an atomic fetch-add; we can get by with a load followed by
	 * a store.
	 */
	size_t cur_eset_npages =
	    atomic_load_zu(&eset->npages, ATOMIC_RELAXED);
	atomic_store_zu(&eset->npages, cur_eset_npages + npages,
	    ATOMIC_RELAXED);
}